

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O2

optional<TokenPipe> TokenPipe::Make(void)

{
  int iVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar2;
  _Storage<TokenPipe,_false> in_RDI;
  long in_FS_OFFSET;
  optional<TokenPipe> oVar3;
  int fds [2];
  TokenPipe local_20;
  int local_18 [2];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[0] = -1;
  local_18[1] = -1;
  iVar1 = pipe2(local_18,0x80000);
  if (iVar1 == 0) {
    local_20.m_fds[0] = local_18[0];
    local_20.m_fds[1] = local_18[1];
    std::_Optional_payload_base<TokenPipe>::_Optional_payload_base<TokenPipe>();
    ~TokenPipe(&local_20);
    uVar2 = extraout_EDX_00;
  }
  else {
    *(undefined1 *)(in_RDI.field2 + 8) = 0;
    uVar2 = extraout_EDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
    super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>.
    _8_4_ = uVar2;
    oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
    super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>.
    _M_payload.field2 = in_RDI.field2;
    return (optional<TokenPipe>)
           oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
           super__Optional_payload<TokenPipe,_true,_false,_false>.
           super__Optional_payload_base<TokenPipe>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<TokenPipe> TokenPipe::Make()
{
    int fds[2] = {-1, -1};
#if HAVE_O_CLOEXEC && HAVE_DECL_PIPE2
    if (pipe2(fds, O_CLOEXEC) != 0) {
        return std::nullopt;
    }
#else
    if (pipe(fds) != 0) {
        return std::nullopt;
    }
#endif
    return TokenPipe(fds);
}